

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFrameMoving.h
# Opt level: O2

void __thiscall
chrono::ChFrameMoving<double>::ConcatenatePreTransformation
          (ChFrameMoving<double> *this,ChFrameMoving<double> *T)

{
  ChFrameMoving<double> res;
  ChVector<double> local_148;
  ChQuaternion<double> local_130;
  ChFrameMoving<double> local_110;
  
  local_148.m_data[2] = 0.0;
  local_130.m_data[0] = 1.0;
  local_130.m_data[3] = 0.0;
  local_148.m_data[0] = 0.0;
  local_148.m_data[1] = 0.0;
  local_130.m_data[1] = 0.0;
  local_130.m_data[2] = 0.0;
  ChFrameMoving(&local_110,&local_148,&local_130);
  TransformLocalToParent(T,this,&local_110);
  operator=(this,&local_110);
  return;
}

Assistant:

void ConcatenatePreTransformation(const ChFrameMoving<Real>& T) {
        ChFrameMoving<Real> res;
        T.TransformLocalToParent(*this, res);
        *this = res;
    }